

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

string * __thiscall
Corrade::Utility::String::Implementation::stripSuffix
          (string *__return_storage_ptr__,Implementation *this,string *string,
          ArrayView<const_char> suffix)

{
  Implementation *pIVar1;
  bool bVar2;
  ostream *output;
  undefined8 uVar3;
  long lVar4;
  ArrayView<const_char> suffix_00;
  Error local_40;
  
  suffix_00._size = suffix._data;
  suffix_00._data = (char *)string;
  bVar2 = endsWith(*(ArrayView<const_char> *)this,suffix_00);
  if (!bVar2) {
    output = Error::defaultOutput();
    Error::Error(&local_40,output,(Flags)0x0);
    Debug::operator<<(&local_40.super_Debug,
                      "Utility::String::stripSuffix(): string doesn\'t end with given suffix");
    Error::~Error(&local_40);
    abort();
  }
  lVar4 = (long)*(char **)(this + 8) - (long)suffix_00._size;
  if (suffix_00._size <= *(char **)(this + 8)) {
    *(long *)(this + 8) = lVar4;
    *(undefined1 *)(*(long *)this + lVar4) = 0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pIVar1 = this + 0x10;
    if (*(Implementation **)this == pIVar1) {
      uVar3 = *(undefined8 *)(this + 0x18);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)pIVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*(Implementation **)this;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)pIVar1;
    }
    __return_storage_ptr__->_M_string_length = *(size_type *)(this + 8);
    *(Implementation **)this = pIVar1;
    *(undefined8 *)(this + 8) = 0;
    this[0x10] = (Implementation)0x0;
    return __return_storage_ptr__;
  }
  uVar3 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase")
  ;
  Error::~Error(&local_40);
  _Unwind_Resume(uVar3);
}

Assistant:

std::string stripSuffix(std::string string, const Containers::ArrayView<const char> suffix) {
    CORRADE_ASSERT(endsWith({string.data(), string.size()}, suffix),
        "Utility::String::stripSuffix(): string doesn't end with given suffix", {});
    string.erase(string.size() - suffix.size());
    return string;
}